

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

int fsg_model_accept(fsg_model_t *fsg,char *words)

{
  bitvec_t *__s;
  int32 iVar1;
  int iVar2;
  fsg_link_t *pfVar3;
  int iVar4;
  fsg_link_t *link;
  fsg_arciter_t *itor;
  bitvec_t *tmp;
  int state;
  int wid;
  int found;
  int n;
  bitvec_t *next;
  bitvec_t *active;
  char *pcStack_38;
  char delimfound;
  char *word;
  char *mutable_words;
  char *ptr;
  char *words_local;
  fsg_model_t *fsg_local;
  
  state = 0;
  if ((fsg == (fsg_model_t *)0x0) || (words == (char *)0x0)) {
    fsg_local._4_4_ = 0;
  }
  else {
    ptr = words;
    words_local = (char *)fsg;
    next = (bitvec_t *)
           __ckd_calloc__((long)((fsg->n_state + 0x1f) / 0x20),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x3c3);
    _found = (bitvec_t *)
             __ckd_calloc__((long)((*(int *)(words_local + 0x38) + 0x1f) / 0x20),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x3c4);
    next[*(int *)(words_local + 0x3c) / 0x20] =
         next[*(int *)(words_local + 0x3c) / 0x20] |
         (uint)(1L << ((byte)*(undefined4 *)(words_local + 0x3c) & 0x1f));
    word = __ckd_salloc__(ptr,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x3c8);
    mutable_words = word;
    while (__s = next,
          iVar1 = nextword(mutable_words," \t\r\n\v\f",&stack0xffffffffffffffc8,
                           (char *)((long)&active + 7)), -1 < iVar1) {
      iVar2 = fsg_model_word_id((fsg_model_t *)words_local,pcStack_38);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x3cf,"word: %s\n",pcStack_38);
      apply_closure((fsg_model_t *)words_local,next);
      if (iVar2 < 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x3d7,"word %s not found!\n",pcStack_38);
        goto LAB_001467af;
      }
      for (tmp._0_4_ = 0; (int)(uint)tmp < *(int *)(words_local + 0x38); tmp._0_4_ = (uint)tmp + 1)
      {
        if (((ulong)next[(int)(uint)tmp / 0x20] & 1L << ((byte)(uint)tmp & 0x1f)) != 0) {
          for (link = (fsg_link_t *)fsg_model_arcs((fsg_model_t *)words_local,(uint)tmp);
              link != (fsg_link_t *)0x0;
              link = (fsg_link_t *)fsg_arciter_next((fsg_arciter_t *)link)) {
            pfVar3 = fsg_arciter_get((fsg_arciter_t *)link);
            if (pfVar3->wid == iVar2) {
              iVar4 = pfVar3->to_state / 0x20;
              _found[iVar4] = _found[iVar4] | (uint)(1L << ((byte)pfVar3->to_state & 0x1f));
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0x3e6,"%s %d -> %d\n",pcStack_38,(ulong)(uint)tmp,pfVar3->to_state);
            }
          }
        }
      }
      next = _found;
      _found = __s;
      memset(__s,0,(long)((*(int *)(words_local + 0x38) + 0x1f) / 0x20) << 2);
      pcStack_38[iVar1] = active._7_1_;
      mutable_words = pcStack_38 + iVar1;
    }
    apply_closure((fsg_model_t *)words_local,next);
    state = next[*(int *)(words_local + 0x40) / 0x20] &
            (uint)(1L << ((byte)*(undefined4 *)(words_local + 0x40) & 0x1f));
LAB_001467af:
    ckd_free(next);
    ckd_free(_found);
    ckd_free(word);
    fsg_local._4_4_ = (uint)(state != 0);
  }
  return fsg_local._4_4_;
}

Assistant:

int
fsg_model_accept(fsg_model_t *fsg, char const *words)
{
    char *ptr, *mutable_words, *word, delimfound;
    bitvec_t *active, *next;
    int n, found = 0;

    if (fsg == NULL || words == NULL)
        return 0;

    active = bitvec_alloc(fsg_model_n_state(fsg));
    next = bitvec_alloc(fsg_model_n_state(fsg));
    bitvec_set(active, fsg_model_start_state(fsg));

    /* For each input word */
    ptr = mutable_words = ckd_salloc(words);
    while ((n = nextword(ptr, " \t\r\n\v\f",
                         &word, &delimfound)) >= 0) {
        int wid = fsg_model_word_id(fsg, word);
        int state;
        bitvec_t *tmp;

        E_INFO("word: %s\n", word);
        /* Expand using previously calculated closure. */
        apply_closure(fsg, active);

        /* Consume the current word, following all non-epsilon
         * transitions possible. */
        if (wid < 0) {
            /* Immediate fail */
            E_INFO("word %s not found!\n", word);
            goto done;
        }
        /* Again, my apologies, this is a bit slow. */
        for (state = 0; state < fsg_model_n_state(fsg); ++state) {
            fsg_arciter_t *itor;
            if (!bitvec_is_set(active, state))
                continue;
            for (itor = fsg_model_arcs(fsg, state);
                 itor != NULL; itor = fsg_arciter_next(itor)) {
                fsg_link_t *link = fsg_arciter_get(itor);
                /* Ignore epsilons, we already did them. */
                if (link->wid == wid) {
                    bitvec_set(next, link->to_state);
                    E_INFO("%s %d -> %d\n",
                           word, state, link->to_state);
                }
            }
        }

        /* Update active list. */
        tmp = active;
        active = next;
        next = tmp;
        bitvec_clear_all(next, fsg_model_n_state(fsg));
        
        word[n] = delimfound;
        ptr = word + n;
    }
    /* Did we reach the final state? First expand any epsilons, then
     * we'll find out! */
    apply_closure(fsg, active);
    found = bitvec_is_set(active, fsg_model_final_state(fsg));

done:
    bitvec_free(active);
    bitvec_free(next);
    ckd_free(mutable_words);
    return found != 0;
}